

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::ConcatenateColumns::dim_forward
          (Dim *__return_storage_ptr__,ConcatenateColumns *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  pointer pDVar2;
  long lVar3;
  invalid_argument *this_00;
  uint uVar4;
  uint uVar5;
  ostringstream s;
  string local_1b0 [32];
  uint local_190 [94];
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar1 == pDVar2) {
    __assert_fail("xs.size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x22a,
                  "virtual Dim cnn::ConcatenateColumns::dim_forward(const vector<Dim> &) const");
  }
  uVar4 = 1;
  local_190[0] = 1;
  if (pDVar2->nd != 0) {
    local_190[0] = pDVar2->d[0];
  }
  local_190[1] = 0;
  do {
    if (pDVar2->nd == 0) {
      uVar5 = 1;
      if (local_190[0] != 1) goto LAB_0025f0e7;
    }
    else {
      if (pDVar2->d[0] != local_190[0]) {
LAB_0025f0e7:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"Bad input dimensions in ConcatenateColumns: ",0x2c);
        operator<<((ostream *)local_190,xs);
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this_00,local_1b0);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      uVar5 = 1;
      if (pDVar2->nd != 1) {
        uVar5 = pDVar2->d[1];
      }
    }
    local_190[1] = local_190[1] + uVar5;
    uVar5 = pDVar2->bd;
    if (pDVar2->bd < uVar4) {
      uVar5 = uVar4;
    }
    uVar4 = uVar5;
    pDVar2 = pDVar2 + 1;
    if (pDVar2 == pDVar1) {
      __return_storage_ptr__->nd = 0;
      lVar3 = 0;
      __return_storage_ptr__->bd = uVar4;
      do {
        uVar4 = __return_storage_ptr__->nd;
        uVar5 = *(uint *)((long)local_190 + lVar3);
        lVar3 = lVar3 + 4;
        __return_storage_ptr__->nd = uVar4 + 1;
        __return_storage_ptr__->d[uVar4] = uVar5;
      } while (lVar3 != 8);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}